

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O0

bool __thiscall OpenMD::SelectionCompiler::compileExpression(SelectionCompiler *this)

{
  reference pvVar1;
  size_type sVar2;
  long in_RDI;
  bool bVar3;
  int tokCommand;
  uint i;
  ulong in_stack_ffffffffffffffd0;
  int itoken;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  uint local_14;
  bool local_1;
  
  itoken = (int)(in_stack_ffffffffffffffd0 >> 0x20);
  local_14 = 1;
  pvVar1 = std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::operator[]
                     ((vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)(in_RDI + 0xe0),0);
  if (pvVar1->tok == 0x301) {
    local_14 = 2;
  }
  else {
    if ((pvVar1->tok & 0x8000U) != 0) {
      while( true ) {
        in_stack_ffffffffffffffd0 = (ulong)local_14;
        sVar2 = std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::size
                          ((vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)(in_RDI + 0xe0))
        ;
        bVar3 = false;
        if (in_stack_ffffffffffffffd0 < sVar2) {
          pvVar1 = std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::operator[]
                             ((vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)
                              (in_RDI + 0xe0),(ulong)local_14);
          bVar3 = pvVar1->tok != 0x400;
        }
        if (!bVar3) break;
        local_14 = local_14 + 1;
      }
      in_stack_ffffffffffffffdf = 0;
    }
    itoken = (int)(in_stack_ffffffffffffffd0 >> 0x20);
  }
  sVar2 = std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::size
                    ((vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)(in_RDI + 0xe0));
  if (local_14 < sVar2) {
    local_1 = compileExpression((SelectionCompiler *)
                                CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),itoken
                               );
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool SelectionCompiler::compileExpression() {
    /** todo */
    unsigned int i = 1;
    int tokCommand = atokenCommand[0].tok;
    if (tokCommand == Token::define) {
      i = 2;
    } else if ((tokCommand & Token::embeddedExpression) != 0) {
      // look for the open parenthesis
      while (i < atokenCommand.size() &&
             atokenCommand[i].tok != Token::leftparen)
        ++i;
    }

    if (i >= atokenCommand.size()) { return true; }
    return compileExpression(i);
  }